

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::MemPass::GetPtr(MemPass *this,uint32_t ptrId,uint32_t *varId)

{
  Op OVar1;
  IRContext *pIVar2;
  uint32_t uVar3;
  Instruction *this_00;
  Instruction *this_01;
  
  *varId = ptrId;
  pIVar2 = (this->super_Pass).context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  this_00 = analysis::DefUseManager::GetDef
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,*varId);
  OVar1 = this_00->opcode_;
  this_01 = this_00;
  if ((OVar1 != OpVariable) && (OVar1 != OpFunctionParameter)) {
    if (OVar1 == OpConstantNull) {
      *varId = 0;
      return this_00;
    }
    this_01 = Instruction::GetBaseAddress(this_00);
  }
  uVar3 = 0;
  if ((this_01->opcode_ == OpVariable) && (uVar3 = 0, this_01->has_result_id_ == true)) {
    uVar3 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  *varId = uVar3;
  OVar1 = this_00->opcode_;
  while (OVar1 == OpCopyObject) {
    uVar3 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar3 = (uint)this_00->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(this_00,uVar3);
    pIVar2 = (this->super_Pass).context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    this_00 = analysis::DefUseManager::GetDef
                        ((pIVar2->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,uVar3);
    OVar1 = this_00->opcode_;
  }
  return this_00;
}

Assistant:

Instruction* MemPass::GetPtr(uint32_t ptrId, uint32_t* varId) {
  *varId = ptrId;
  Instruction* ptrInst = get_def_use_mgr()->GetDef(*varId);
  Instruction* varInst;

  if (ptrInst->opcode() == spv::Op::OpConstantNull) {
    *varId = 0;
    return ptrInst;
  }

  if (ptrInst->opcode() != spv::Op::OpVariable &&
      ptrInst->opcode() != spv::Op::OpFunctionParameter) {
    varInst = ptrInst->GetBaseAddress();
  } else {
    varInst = ptrInst;
  }
  if (varInst->opcode() == spv::Op::OpVariable) {
    *varId = varInst->result_id();
  } else {
    *varId = 0;
  }

  while (ptrInst->opcode() == spv::Op::OpCopyObject) {
    uint32_t temp = ptrInst->GetSingleWordInOperand(0);
    ptrInst = get_def_use_mgr()->GetDef(temp);
  }

  return ptrInst;
}